

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
::~table_core(table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
              *this)

{
  value_type_pointer p;
  table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
  *local_18;
  undefined1 *local_10;
  
  local_10 = (undefined1 *)&local_18;
  local_18 = this;
  for_all_elements_while<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____external_boost_unordered_hpp:6939:48)>
            (&this->arrays,(anon_class_8_1_54a39806 *)&local_10);
  p = (this->arrays).elements_;
  if (p != (value_type_pointer)0x0) {
    operator_delete(p,(((this->arrays).groups_size_mask * 0x268 + 0x276) / 5 & 0xfffffffffffffff8) *
                      5);
  }
  return;
}

Assistant:

~table_core() noexcept {
        for_all_elements([this](element_type* p) { destroy_element(p); });
        delete_arrays(arrays);
    }